

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O0

void fekete_subrule_5(int suborder_num,double *suborder_xyz,double *suborder_w)

{
  int local_24;
  int s;
  double *suborder_w_local;
  double *suborder_xyz_local;
  int suborder_num_local;
  
  for (local_24 = 0; local_24 < suborder_num; local_24 = local_24 + 1) {
    suborder_xyz[local_24 * 3] = fekete_subrule_5::suborder_xy_rule_5[local_24 * 3];
    suborder_xyz[local_24 * 3 + 1] = fekete_subrule_5::suborder_xy_rule_5[local_24 * 3 + 1];
    suborder_xyz[local_24 * 3 + 2] = fekete_subrule_5::suborder_xy_rule_5[local_24 * 3 + 2];
  }
  for (local_24 = 0; local_24 < suborder_num; local_24 = local_24 + 1) {
    suborder_w[local_24] = fekete_subrule_5::suborder_w_rule_5[local_24];
  }
  return;
}

Assistant:

void fekete_subrule_5 ( int suborder_num, double suborder_xyz[], 
  double suborder_w[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEKETE_SUBRULE_5 returns a compressed Fekete rule 5.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 December 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Mark Taylor, Beth Wingate, Rachel Vincent,
//    An Algorithm for Computing Fekete Points in the Triangle,
//    SIAM Journal on Numerical Analysis,
//    Volume 38, Number 5, 2000, pages 1707-1720.
//
//  Parameters:
//
//    Input, int SUBORDER_NUM, the number of suborders of the rule.
//
//    Output, double SUBORDER_XYZ[3*SUBORDER_NUM],
//    the barycentric coordinates of the abscissas.
//
//    Output, double SUBORDER_W[SUBORDER_NUM], the suborder weights.
//
{
  int s;
  static double suborder_xy_rule_5[3*21] = {
      0.3333333333,  0.3333333333, 0.3333333334, 
      0.2201371125,  0.3169406831, 0.4629222044, 
      0.2201371125,  0.4629222044, 0.3169406831, 
      0.1877171129,  0.1877171129, 0.6245657742, 
      0.1403402144,  0.4298298928, 0.4298298928, 
      0.0833252778,  0.0833252778, 0.8333494444, 
      0.0664674598,  0.0252297247, 0.9083028155, 
      0.0218884020,  0.4890557990, 0.4890557990, 
      0.0252297247,  0.0664674598, 0.9083028155, 
      0.0000000000,  0.5000000000, 0.5000000000, 
      0.0000000000,  0.0000000000, 1.0000000000, 
      0.1157463404,  0.2842319093, 0.6000217503, 
      0.0672850606,  0.3971764400, 0.5355384994, 
      0.0909839531,  0.1779000668, 0.7311159801, 
      0.0318311633,  0.3025963402, 0.6655724965, 
      0.0273518579,  0.1733665506, 0.7992815915, 
      0.0000000000,  0.3753565349, 0.6246434651, 
      0.0000000000,  0.2585450895, 0.7414549105, 
      0.0000000000,  0.1569057655, 0.8430942345, 
      0.0000000000,  0.0768262177, 0.9231737823, 
      0.0000000000,  0.0233450767, 0.9766549233 };
  static double suborder_w_rule_5[21] = {
      0.0485965670, 
      0.0602711576, 
      0.0602711576, 
      0.0476929767, 
      0.0453940802, 
      0.0258019417, 
      0.0122004614, 
      0.0230003812, 
      0.0122004614, 
      0.0018106475, 
     -0.0006601747, 
      0.0455413513, 
      0.0334182802, 
      0.0324896773, 
      0.0299402736, 
      0.0233477738, 
      0.0065962854, 
      0.0021485117, 
      0.0034785755, 
      0.0013990566, 
      0.0028825748 };

  for ( s = 0; s < suborder_num; s++ )
  {
    suborder_xyz[0+s*3] = suborder_xy_rule_5[0+s*3];
    suborder_xyz[1+s*3] = suborder_xy_rule_5[1+s*3];
    suborder_xyz[2+s*3] = suborder_xy_rule_5[2+s*3];
  }

  for ( s = 0; s < suborder_num; s++ )
  {
    suborder_w[s] = suborder_w_rule_5[s];
  }

  return;
}